

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::find_or_prepare_insert<cs_impl::any>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
           *this,any *key,size_t hashval)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  proxy *ppVar3;
  proxy *ppVar4;
  baseHolder *pbVar5;
  uint uVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  size_t unaff_R12;
  ulong uVar13;
  bool bVar14;
  char cVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  __m128i match;
  undefined1 auVar21 [16];
  pair<unsigned_long,_bool> pVar22;
  long local_78;
  char cVar18;
  char cVar19;
  char cVar20;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar11 = hashval >> 7 & uVar2;
  auVar16 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar16 = pshuflw(auVar16,auVar16,0);
  local_78 = 0;
  do {
    auVar1 = *(undefined1 (*) [16])(this->ctrl_ + uVar11);
    cVar15 = auVar16[0];
    auVar17[0] = -(cVar15 == auVar1[0]);
    cVar18 = auVar16[1];
    auVar17[1] = -(cVar18 == auVar1[1]);
    cVar19 = auVar16[2];
    auVar17[2] = -(cVar19 == auVar1[2]);
    cVar20 = auVar16[3];
    auVar17[3] = -(cVar20 == auVar1[3]);
    auVar17[4] = -(cVar15 == auVar1[4]);
    auVar17[5] = -(cVar18 == auVar1[5]);
    auVar17[6] = -(cVar19 == auVar1[6]);
    auVar17[7] = -(cVar20 == auVar1[7]);
    auVar17[8] = -(cVar15 == auVar1[8]);
    auVar17[9] = -(cVar18 == auVar1[9]);
    auVar17[10] = -(cVar19 == auVar1[10]);
    auVar17[0xb] = -(cVar20 == auVar1[0xb]);
    auVar17[0xc] = -(cVar15 == auVar1[0xc]);
    auVar17[0xd] = -(cVar18 == auVar1[0xd]);
    auVar17[0xe] = -(cVar19 == auVar1[0xe]);
    auVar17[0xf] = -(cVar20 == auVar1[0xf]);
    uVar7 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    bVar14 = uVar7 == 0;
    if (!bVar14) {
      uVar9 = (uint)uVar7;
      do {
        uVar6 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        uVar13 = uVar6 + uVar11 & uVar2;
        ppVar3 = this->slots_[uVar13].value.first.mDat;
        ppVar4 = key->mDat;
        cVar15 = ppVar4 == (proxy *)0x0;
        if (ppVar3 == (proxy *)0x0) {
LAB_001665cb:
          iVar8 = 1;
          if (cVar15 != '\0') goto LAB_001665ee;
        }
        else if (ppVar4 != (proxy *)0x0) {
          pbVar5 = ppVar3->data;
          iVar8 = (*pbVar5->_vptr_baseHolder[4])(pbVar5,ppVar4->data);
          cVar15 = (char)iVar8;
          goto LAB_001665cb;
        }
        uVar9 = uVar9 - 1 & uVar9;
        bVar14 = uVar9 == 0;
      } while (!bVar14);
    }
    iVar8 = 4;
    uVar13 = unaff_R12;
LAB_001665ee:
    if (bVar14) {
      auVar21[0] = -(auVar1[0] == -0x80);
      auVar21[1] = -(auVar1[1] == -0x80);
      auVar21[2] = -(auVar1[2] == -0x80);
      auVar21[3] = -(auVar1[3] == -0x80);
      auVar21[4] = -(auVar1[4] == -0x80);
      auVar21[5] = -(auVar1[5] == -0x80);
      auVar21[6] = -(auVar1[6] == -0x80);
      auVar21[7] = -(auVar1[7] == -0x80);
      auVar21[8] = -(auVar1[8] == -0x80);
      auVar21[9] = -(auVar1[9] == -0x80);
      auVar21[10] = -(auVar1[10] == -0x80);
      auVar21[0xb] = -(auVar1[0xb] == -0x80);
      auVar21[0xc] = -(auVar1[0xc] == -0x80);
      auVar21[0xd] = -(auVar1[0xd] == -0x80);
      auVar21[0xe] = -(auVar1[0xe] == -0x80);
      auVar21[0xf] = -(auVar1[0xf] == -0x80);
      iVar8 = 3;
      if ((((((((((((((((auVar21 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar21 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar21 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar21 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar21 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar21 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar21 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar21 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar21 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar21 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar21 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar21 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar21 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar21 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar21 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar21[0xf])
      {
        lVar12 = uVar11 + local_78;
        local_78 = local_78 + 0x10;
        uVar11 = lVar12 + 0x10U & uVar2;
        iVar8 = 0;
      }
    }
    unaff_R12 = uVar13;
    if (iVar8 != 0) {
      if (iVar8 == 3) {
        uVar13 = prepare_insert(this,hashval);
        uVar10 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      else {
        uVar10 = 0;
      }
      pVar22._8_8_ = uVar10;
      pVar22.first = uVar13;
      return pVar22;
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}